

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.hpp
# Opt level: O1

void __thiscall
libtest::printer::cprintln<std::__cxx11::string>
          (printer *this,ansi_sgr *command,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  ostream *poVar1;
  string local_68;
  string local_48;
  ansi_sgr local_28;
  
  poVar1 = this->os;
  ansi_sgr::to_string_abi_cxx11_(&local_48,command);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_48._M_dataplus._M_p,local_48._M_string_length);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (this->os,(args->_M_dataplus)._M_p,args->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  poVar1 = this->os;
  local_28.m_color = white;
  local_28.m_attr = reset;
  ansi_sgr::to_string_abi_cxx11_(&local_68,&local_28);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_68._M_dataplus._M_p,local_68._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cprintln(const ansi_sgr& command, Args... args) { os << command.to_string(), println(args...), os << ansi_sgr{}.to_string(); }